

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void xml_string_copy(xml_string *string,uint8_t *buffer,size_t length)

{
  size_t local_28;
  size_t length_local;
  uint8_t *buffer_local;
  xml_string *string_local;
  
  if (string != (xml_string *)0x0) {
    local_28 = length;
    if (string->length <= length) {
      local_28 = string->length;
    }
    memcpy(buffer,string->buffer,local_28);
  }
  return;
}

Assistant:

void xml_string_copy(struct xml_string* string, uint8_t* buffer, size_t length) {
	if (!string) {
		return;
	}

	#define min(X,Y) ((X) < (Y) ? (X) : (Y))
	length = min(length, string->length);
	#undef min

	memcpy(buffer, string->buffer, length);
}